

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkLinActuator.cpp
# Opt level: O2

void __thiscall chrono::ChLinkLinActuator::ChLinkLinActuator(ChLinkLinActuator *this)

{
  __shared_ptr<chrono::ChFunction_Const,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  ChLinkLockLock::ChLinkLockLock(&this->super_ChLinkLockLock);
  (this->super_ChLinkLockLock).super_ChLinkLock.super_ChLinkMarkers.super_ChLink.super_ChLinkBase.
  super_ChPhysicsItem.super_ChObj._vptr_ChObj = &PTR__ChLinkLinActuator_01165da8;
  (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->dist_funct).super___shared_ptr<chrono::ChFunction,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->offset = 0.1;
  std::make_shared<chrono::ChFunction_Const,int>((int *)&local_20);
  std::__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<chrono::ChFunction,(__gnu_cxx::_Lock_policy)2> *)&this->dist_funct,
             &local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  ChLinkMaskLF::SetLockMask
            (&(this->super_ChLinkLockLock).super_ChLinkLock.mask,true,false,false,false,false,false,
             false);
  ChLinkLock::BuildLink((ChLinkLock *)this);
  return;
}

Assistant:

ChLinkLinActuator::ChLinkLinActuator() : offset(0.1) {
    dist_funct = chrono_types::make_shared<ChFunction_Const>(0);

    // Mask: initialize our LinkMaskLF (lock formulation mask)
    mask.SetLockMask(true, false, false, false, false, false, false);
    BuildLink();
}